

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O1

void mnist_model_build(mnist_model *model)

{
  ggml_context *pgVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  ggml_tensor *pgVar5;
  char *pcVar6;
  int extraout_EDX;
  char *pcVar7;
  ggml_tensor **ppgVar8;
  ggml_tensor **ppgVar9;
  
  iVar2 = std::__cxx11::string::compare((char *)model);
  if (iVar2 == 0) {
    ggml_set_param(model->ctx_compute,model->fc1_weight);
    ggml_set_param(model->ctx_compute,model->fc1_bias);
    ppgVar9 = &model->fc2_weight;
    ggml_set_param(model->ctx_compute,model->fc2_weight);
    ppgVar8 = &model->fc2_bias;
    ggml_set_param(model->ctx_compute,model->fc2_bias);
    pgVar1 = model->ctx_compute;
    uVar3 = ggml_mul_mat(pgVar1,model->fc1_weight,model->images);
    uVar3 = ggml_add(pgVar1,uVar3,model->fc1_bias);
    lVar4 = ggml_relu(pgVar1,uVar3);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)model);
    if (iVar2 != 0) {
      pcVar6 = "false";
      uVar3 = 0x174;
      goto LAB_00105b30;
    }
    ggml_set_param(model->ctx_compute,model->conv1_kernel);
    ggml_set_param(model->ctx_compute,model->conv1_bias);
    ggml_set_param(model->ctx_compute,model->conv2_kernel);
    ggml_set_param(model->ctx_compute,model->conv2_bias);
    ggml_set_param(model->ctx_compute,model->dense_weight);
    ggml_set_param(model->ctx_compute,model->dense_bias);
    uVar3 = ggml_reshape_4d(model->ctx_compute,model->images,0x1c,0x1c,1,model->images->ne[1]);
    pgVar1 = model->ctx_compute;
    uVar3 = ggml_conv_2d(pgVar1,model->conv1_kernel,uVar3,1,1,1,1,1,1);
    uVar3 = ggml_add(pgVar1,uVar3,model->conv1_bias);
    lVar4 = ggml_relu(pgVar1,uVar3);
    if (*(long *)(lVar4 + 0x10) != 0x1c) {
      pcVar6 = "conv1_out->ne[0] == MNIST_HW";
      uVar3 = 0x151;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x18) != 0x1c) {
      pcVar6 = "conv1_out->ne[1] == MNIST_HW";
      uVar3 = 0x152;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x20) != 8) {
      pcVar6 = "conv1_out->ne[2] == MNIST_CNN_NCB";
      uVar3 = 0x153;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x28) != (long)model->nbatch_physical) {
      pcVar6 = "conv1_out->ne[3] == model.nbatch_physical";
      uVar3 = 0x154;
      goto LAB_00105b30;
    }
    lVar4 = ggml_pool_2d(0,0,model->ctx_compute,lVar4,0,2,2,2,2);
    if (*(long *)(lVar4 + 0x10) != 0xe) {
      pcVar6 = "conv2_in->ne[0] == MNIST_HW/2";
      uVar3 = 0x157;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x18) != 0xe) {
      pcVar6 = "conv2_in->ne[1] == MNIST_HW/2";
      uVar3 = 0x158;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x20) != 8) {
      pcVar6 = "conv2_in->ne[2] == MNIST_CNN_NCB";
      uVar3 = 0x159;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x28) != (long)model->nbatch_physical) {
      pcVar6 = "conv2_in->ne[3] == model.nbatch_physical";
      uVar3 = 0x15a;
      goto LAB_00105b30;
    }
    pgVar1 = model->ctx_compute;
    uVar3 = ggml_conv_2d(pgVar1,model->conv2_kernel,lVar4,1,1,1,1,1,1);
    uVar3 = ggml_add(pgVar1,uVar3,model->conv2_bias);
    lVar4 = ggml_relu(pgVar1,uVar3);
    if (*(long *)(lVar4 + 0x10) != 0xe) {
      pcVar6 = "conv2_out->ne[0] == MNIST_HW/2";
      uVar3 = 0x15f;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x18) != 0xe) {
      pcVar6 = "conv2_out->ne[1] == MNIST_HW/2";
      uVar3 = 0x160;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x20) != 0x10) {
      pcVar6 = "conv2_out->ne[2] == MNIST_CNN_NCB*2";
      uVar3 = 0x161;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x28) != (long)model->nbatch_physical) {
      pcVar6 = "conv2_out->ne[3] == model.nbatch_physical";
      uVar3 = 0x162;
      goto LAB_00105b30;
    }
    lVar4 = ggml_pool_2d(0,0,model->ctx_compute,lVar4,0,2,2,2,2);
    if (*(long *)(lVar4 + 0x10) != 7) {
      pcVar6 = "dense_in->ne[0] == MNIST_HW/4";
      uVar3 = 0x165;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x18) != 7) {
      pcVar6 = "dense_in->ne[1] == MNIST_HW/4";
      uVar3 = 0x166;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x20) != 0x10) {
      pcVar6 = "dense_in->ne[2] == MNIST_CNN_NCB*2";
      uVar3 = 0x167;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x28) != (long)model->nbatch_physical) {
      pcVar6 = "dense_in->ne[3] == model.nbatch_physical";
      uVar3 = 0x168;
      goto LAB_00105b30;
    }
    pgVar1 = model->ctx_compute;
    uVar3 = ggml_permute(pgVar1,lVar4,1,2,0,3);
    uVar3 = ggml_cont(pgVar1,uVar3);
    lVar4 = ggml_reshape_2d(pgVar1,uVar3,0x310,(long)model->nbatch_physical);
    if (*(long *)(lVar4 + 0x10) != 0x310) {
      pcVar6 = "dense_in->ne[0] == (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2)";
      uVar3 = 0x16d;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x18) != (long)model->nbatch_physical) {
      pcVar6 = "dense_in->ne[1] == model.nbatch_physical";
      uVar3 = 0x16e;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x20) != 1) {
      pcVar6 = "dense_in->ne[2] == 1";
      uVar3 = 0x16f;
      goto LAB_00105b30;
    }
    if (*(long *)(lVar4 + 0x28) != 1) {
      pcVar6 = "dense_in->ne[3] == 1";
      uVar3 = 0x170;
      goto LAB_00105b30;
    }
    ppgVar9 = &model->dense_weight;
    ppgVar8 = &model->dense_bias;
  }
  pgVar1 = model->ctx_compute;
  uVar3 = ggml_mul_mat(pgVar1,*ppgVar9,lVar4);
  pgVar5 = (ggml_tensor *)ggml_add(pgVar1,uVar3,*ppgVar8);
  model->logits = pgVar5;
  ggml_set_name(pgVar5,"logits");
  ggml_set_output(model->logits);
  pgVar5 = model->logits;
  if (pgVar5->type == GGML_TYPE_F32) {
    if (pgVar5->ne[0] == 10) {
      if (pgVar5->ne[1] == (long)model->nbatch_physical) {
        if (pgVar5->ne[2] == 1) {
          if (pgVar5->ne[3] == 1) {
            return;
          }
          pcVar6 = "model.logits->ne[3] == 1";
          uVar3 = 0x17d;
        }
        else {
          pcVar6 = "model.logits->ne[2] == 1";
          uVar3 = 0x17c;
        }
      }
      else {
        pcVar6 = "model.logits->ne[1] == model.nbatch_physical";
        uVar3 = 0x17b;
      }
    }
    else {
      pcVar6 = "model.logits->ne[0] == MNIST_NCLASSES";
      uVar3 = 0x17a;
    }
  }
  else {
    pcVar6 = "model.logits->type == GGML_TYPE_F32";
    uVar3 = 0x179;
  }
LAB_00105b30:
  pcVar7 = 
  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
  ;
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
             ,uVar3,"GGML_ASSERT(%s) failed",pcVar6);
  ggml_opt_fit(*(undefined8 *)(pcVar7 + 0x20),*(undefined8 *)(pcVar7 + 0xb8),
               *(undefined8 *)(pcVar7 + 0x48),*(undefined8 *)(pcVar7 + 0x50),uVar3,2,
               ggml_opt_get_default_optimizer_params,(long)extraout_EDX,
               (long)*(int *)(pcVar7 + 0x40),0,model);
  return;
}

Assistant:

void mnist_model_build(mnist_model & model) {
    if (model.arch == "mnist-fc") {
        ggml_set_param(model.ctx_compute, model.fc1_weight);
        ggml_set_param(model.ctx_compute, model.fc1_bias);
        ggml_set_param(model.ctx_compute, model.fc2_weight);
        ggml_set_param(model.ctx_compute, model.fc2_bias);

        ggml_tensor * fc1 = ggml_relu(model.ctx_compute, ggml_add(model.ctx_compute,
            ggml_mul_mat(model.ctx_compute, model.fc1_weight, model.images),
            model.fc1_bias));
        model.logits = ggml_add(model.ctx_compute,
            ggml_mul_mat(model.ctx_compute, model.fc2_weight, fc1),
            model.fc2_bias);
    } else if (model.arch == "mnist-cnn") {
        ggml_set_param(model.ctx_compute, model.conv1_kernel);
        ggml_set_param(model.ctx_compute, model.conv1_bias);
        ggml_set_param(model.ctx_compute, model.conv2_kernel);
        ggml_set_param(model.ctx_compute, model.conv2_bias);
        ggml_set_param(model.ctx_compute, model.dense_weight);
        ggml_set_param(model.ctx_compute, model.dense_bias);

        struct ggml_tensor * images_2D = ggml_reshape_4d(model.ctx_compute, model.images, MNIST_HW, MNIST_HW, 1, model.images->ne[1]);

        struct ggml_tensor * conv1_out = ggml_relu(model.ctx_compute, ggml_add(model.ctx_compute,
            ggml_conv_2d(model.ctx_compute, model.conv1_kernel, images_2D, 1, 1, 1, 1, 1, 1),
            model.conv1_bias));
        GGML_ASSERT(conv1_out->ne[0] == MNIST_HW);
        GGML_ASSERT(conv1_out->ne[1] == MNIST_HW);
        GGML_ASSERT(conv1_out->ne[2] == MNIST_CNN_NCB);
        GGML_ASSERT(conv1_out->ne[3] == model.nbatch_physical);

        struct ggml_tensor * conv2_in = ggml_pool_2d(model.ctx_compute, conv1_out, GGML_OP_POOL_MAX, 2, 2, 2, 2, 0, 0);
        GGML_ASSERT(conv2_in->ne[0] == MNIST_HW/2);
        GGML_ASSERT(conv2_in->ne[1] == MNIST_HW/2);
        GGML_ASSERT(conv2_in->ne[2] == MNIST_CNN_NCB);
        GGML_ASSERT(conv2_in->ne[3] == model.nbatch_physical);

        struct ggml_tensor * conv2_out = ggml_relu(model.ctx_compute, ggml_add(model.ctx_compute,
            ggml_conv_2d(model.ctx_compute, model.conv2_kernel, conv2_in, 1, 1, 1, 1, 1, 1),
            model.conv2_bias));
        GGML_ASSERT(conv2_out->ne[0] == MNIST_HW/2);
        GGML_ASSERT(conv2_out->ne[1] == MNIST_HW/2);
        GGML_ASSERT(conv2_out->ne[2] == MNIST_CNN_NCB*2);
        GGML_ASSERT(conv2_out->ne[3] == model.nbatch_physical);

        struct ggml_tensor * dense_in = ggml_pool_2d(model.ctx_compute, conv2_out, GGML_OP_POOL_MAX, 2, 2, 2, 2, 0, 0);
        GGML_ASSERT(dense_in->ne[0] == MNIST_HW/4);
        GGML_ASSERT(dense_in->ne[1] == MNIST_HW/4);
        GGML_ASSERT(dense_in->ne[2] == MNIST_CNN_NCB*2);
        GGML_ASSERT(dense_in->ne[3] == model.nbatch_physical);

        dense_in = ggml_reshape_2d(model.ctx_compute,
            ggml_cont(model.ctx_compute, ggml_permute(model.ctx_compute, dense_in, 1, 2, 0, 3)),
            (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2), model.nbatch_physical);
        GGML_ASSERT(dense_in->ne[0] == (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2));
        GGML_ASSERT(dense_in->ne[1] == model.nbatch_physical);
        GGML_ASSERT(dense_in->ne[2] == 1);
        GGML_ASSERT(dense_in->ne[3] == 1);

        model.logits = ggml_add(model.ctx_compute, ggml_mul_mat(model.ctx_compute, model.dense_weight, dense_in), model.dense_bias);
    } else {
        GGML_ASSERT(false);
    }

    ggml_set_name(model.logits, "logits");
    ggml_set_output(model.logits);
    GGML_ASSERT(model.logits->type == GGML_TYPE_F32);
    GGML_ASSERT(model.logits->ne[0] == MNIST_NCLASSES);
    GGML_ASSERT(model.logits->ne[1] == model.nbatch_physical);
    GGML_ASSERT(model.logits->ne[2] == 1);
    GGML_ASSERT(model.logits->ne[3] == 1);
}